

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRotationGate2.hpp
# Opt level: O0

void __thiscall
qclab::qgates::QRotationGate2<std::complex<double>_>::QRotationGate2
          (QRotationGate2<std::complex<double>_> *this,int *qubits,rotation_type *rot,bool fixed)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool fixed_local;
  rotation_type *rot_local;
  int *qubits_local;
  QRotationGate2<std::complex<double>_> *this_local;
  
  QGate2<std::complex<double>_>::QGate2(&this->super_QGate2<std::complex<double>_>);
  QAdjustable::QAdjustable(&this->super_QAdjustable,fixed);
  (this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_00758d10;
  uVar1 = *(undefined4 *)((long)&(rot->angle_).cos_ + 4);
  uVar2 = *(undefined4 *)&(rot->angle_).sin_;
  uVar3 = *(undefined4 *)((long)&(rot->angle_).sin_ + 4);
  *(undefined4 *)&(this->rotation_).angle_.cos_ = *(undefined4 *)&(rot->angle_).cos_;
  *(undefined4 *)((long)&(this->rotation_).angle_.cos_ + 4) = uVar1;
  *(undefined4 *)&(this->rotation_).angle_.sin_ = uVar2;
  *(undefined4 *)((long)&(this->rotation_).angle_.sin_ + 4) = uVar3;
  (*(this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject
    [6])(this,qubits);
  return;
}

Assistant:

QRotationGate2( const int* qubits , const rotation_type& rot ,
                        const bool fixed = false )
        : rotation_( rot )
        , QAdjustable( fixed )
        {
          setQubits( qubits ) ;
        }